

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall xmrig::Client::setState(Client *this,SocketState state)

{
  uint64_t uVar1;
  
  if ((this->super_BaseClient).m_state == state) {
    return;
  }
  if (state == HostLookupState) {
    uVar1 = 0;
  }
  else if (state == ReconnectingState) {
    uVar1 = Chrono::steadyMSecs();
    uVar1 = uVar1 + (this->super_BaseClient).m_retryPause;
  }
  else {
    if (state != ConnectingState) goto LAB_00152636;
    uVar1 = Chrono::steadyMSecs();
    uVar1 = uVar1 + 20000;
  }
  this->m_expire = uVar1;
LAB_00152636:
  (this->super_BaseClient).m_state = state;
  return;
}

Assistant:

void xmrig::Client::setState(SocketState state)
{
    LOG_DEBUG("[%s] state: \"%s\"", url(), states[state]);

    if (m_state == state) {
        return;
    }

    switch (state) {
    case HostLookupState:
        m_expire = 0;
        break;

    case ConnectingState:
        m_expire = Chrono::steadyMSecs() + kConnectTimeout;
        break;

    case ReconnectingState:
        m_expire = Chrono::steadyMSecs() + m_retryPause;
        break;

    default:
        break;
    }

    m_state = state;
}